

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  bool bVar1;
  uint uVar2;
  exr_result_t eVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  exr_const_context_t p_Var9;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  uVar7 = (ulong)bufid;
  if (newsz == 0) {
    p_Var9 = encode->context;
    if (p_Var9 == (exr_const_context_t)0x0) {
      return 2;
    }
    uVar2 = encode->part_index;
    uVar6 = (ulong)uVar2;
    if ((-1 < (int)uVar2) && ((int)uVar2 < p_Var9->num_parts)) {
      UNRECOVERED_JUMPTABLE = p_Var9->print_error;
      pcVar8 = "Attempt to allocate 0 byte buffer for transcode buffer %d";
      eVar3 = 3;
      goto LAB_0012df8f;
    }
  }
  else {
    pvVar4 = *buf;
    if ((pvVar4 != (void *)0x0) && (newsz <= *cursz)) {
      return 0;
    }
    internal_encode_free_buffer(encode,bufid,buf,cursz);
    if (encode->alloc_fn == (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
      p_Var9 = encode->context;
      if (p_Var9 == (exr_const_context_t)0x0) {
        pvVar5 = (void *)0x2;
        bVar1 = false;
      }
      else if ((encode->part_index < 0) || (p_Var9->num_parts <= encode->part_index)) {
        bVar1 = false;
        uVar2 = (*p_Var9->print_error)(p_Var9,4,"Part index (%d) out of range");
        pvVar5 = (void *)(ulong)uVar2;
      }
      else {
        pvVar5 = (*p_Var9->alloc_fn)(newsz);
        bVar1 = true;
        pvVar4 = pvVar5;
      }
      if (!bVar1) {
        return (exr_result_t)pvVar5;
      }
    }
    else {
      pvVar4 = (*encode->alloc_fn)(bufid,newsz);
    }
    if (pvVar4 != (void *)0x0) {
      *buf = pvVar4;
      *cursz = newsz;
      return 0;
    }
    p_Var9 = encode->context;
    if (p_Var9 == (exr_const_context_t)0x0) {
      return 2;
    }
    uVar2 = encode->part_index;
    uVar6 = (ulong)uVar2;
    if ((-1 < (int)uVar2) && ((int)uVar2 < p_Var9->num_parts)) {
      eVar3 = (*p_Var9->print_error)
                        (p_Var9,1,"Unable to allocate %lu bytes",newsz,p_Var9->print_error);
      return eVar3;
    }
  }
  UNRECOVERED_JUMPTABLE = p_Var9->print_error;
  pcVar8 = "Part index (%d) out of range";
  eVar3 = 4;
  uVar7 = uVar6;
LAB_0012df8f:
  eVar3 = (*UNRECOVERED_JUMPTABLE)(p_Var9,eVar3,pcVar8,uVar7,UNRECOVERED_JUMPTABLE);
  return eVar3;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        exr_const_context_t ctxt = encode->context;
        EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            exr_const_context_t ctxt = encode->context;
            EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

            curbuf = ctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            exr_const_context_t ctxt = encode->context;
            EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

            return ctxt->print_error (
                ctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}